

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O2

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  long lVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar8 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar9 = (undefined1 (*) [16])(sVar4 * uVar8 * sVar3 + (long)pvVar2);
    fVar13 = (this->super_Clip).min;
    fVar1 = (this->super_Clip).max;
    lVar10 = 0;
    for (iVar12 = 0; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
      auVar14._4_4_ = fVar13;
      auVar14._0_4_ = fVar13;
      auVar14._8_4_ = fVar13;
      auVar14._12_4_ = fVar13;
      auVar14 = maxps(*pauVar9,auVar14);
      auVar5._4_4_ = fVar1;
      auVar5._0_4_ = fVar1;
      auVar5._8_4_ = fVar1;
      auVar5._12_4_ = fVar1;
      auVar14 = minps(auVar14,auVar5);
      *pauVar9 = auVar14;
      pauVar9 = pauVar9 + 1;
      lVar10 = lVar10 + 4;
    }
    lVar11 = sVar4 * sVar3 * uVar8;
    for (; (int)lVar10 < iVar6; lVar10 = lVar10 + 1) {
      fVar13 = *(float *)((long)pvVar2 + lVar10 * 4 + lVar11);
      fVar1 = (this->super_Clip).min;
      if (fVar13 < fVar1) {
        *(float *)((long)pvVar2 + lVar10 * 4 + lVar11) = fVar1;
        fVar13 = fVar1;
      }
      fVar1 = (this->super_Clip).max;
      if (fVar1 < fVar13) {
        *(float *)((long)pvVar2 + lVar10 * 4 + lVar11) = fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}